

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall
Memory::Recycler::FinishPartialCollect(Recycler *this,RecyclerSweepManager *recyclerSweepManager)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined8 *in_FS_OFFSET;
  
  if (recyclerSweepManager != (RecyclerSweepManager *)0x0) {
    bVar3 = RecyclerSweepManager::IsBackground(recyclerSweepManager);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x10ac,
                         "(recyclerSweepManager == nullptr || !recyclerSweepManager->IsBackground())"
                         ,"recyclerSweepManager == nullptr || !recyclerSweepManager->IsBackground()"
                        );
      if (!bVar3) goto LAB_0026b221;
      *puVar1 = 0;
    }
  }
  if (this->inPartialCollectMode == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x10ae,"(inPartialCollectMode)","inPartialCollectMode");
    if (!bVar3) goto LAB_0026b221;
    *puVar1 = 0;
  }
  bVar3 = DoQueueTrackedObject(this);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x10b0,"(!this->DoQueueTrackedObject())","!this->DoQueueTrackedObject()");
    if (!bVar3) {
LAB_0026b221:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  HeapInfoManager::FinishPartialCollect(&this->autoHeap,recyclerSweepManager);
  this->inPartialCollectMode = false;
  ClearPartialCollect(this);
  return;
}

Assistant:

void
Recycler::FinishPartialCollect(RecyclerSweepManager * recyclerSweepManager)
{
    Assert(recyclerSweepManager == nullptr || !recyclerSweepManager->IsBackground());
    RECYCLER_PROFILE_EXEC_BEGIN(this, Js::FinishPartialPhase);
    Assert(inPartialCollectMode);
#if ENABLE_CONCURRENT_GC
    Assert(!this->DoQueueTrackedObject());
#endif

    autoHeap.FinishPartialCollect(recyclerSweepManager);
    this->inPartialCollectMode = false;
    ClearPartialCollect();
    RECYCLER_PROFILE_EXEC_END(this, Js::FinishPartialPhase);
}